

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::GridSequence::getCandidateConstructionPoints
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GridSequence *this,
          TypeDepth type,int output,vector<int,_std::allocator<int>_> *level_limits)

{
  vector<int,_std::allocator<int>_> weights;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((type & ~type_hyperbolic) == type_iptotal) &&
     ((this->super_BaseCanonicalGrid).num_dimensions << ((~type & 6) == 0) + 1 <
      (this->super_BaseCanonicalGrid).points.cache_num_indexes)) {
    estimateAnisotropicCoefficients(this,type,output,(vector<int,_std::allocator<int>_> *)&local_38)
    ;
  }
  getCandidateConstructionPoints
            (__return_storage_ptr__,this,type,(vector<int,_std::allocator<int>_> *)&local_38,
             level_limits);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> GridSequence::getCandidateConstructionPoints(TypeDepth type, int output, const std::vector<int> &level_limits){
    std::vector<int> weights;
    if ((type == type_iptotal) || (type == type_ipcurved) || (type == type_qptotal) || (type == type_qpcurved)){
        int min_needed_points = ((type == type_ipcurved) || (type == type_qpcurved)) ? 4 * num_dimensions : 2 * num_dimensions;
        if (points.getNumIndexes() > min_needed_points) // if there are enough points to estimate coefficients
            estimateAnisotropicCoefficients(type, output, weights);
    }
    return getCandidateConstructionPoints(type, weights, level_limits);
}